

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O2

void __thiscall Epoll::epoll_mod(Epoll *this,SP_Channel *request,int timeout)

{
  __uint32_t _Var1;
  element_type *peVar2;
  int __fd;
  int iVar3;
  __shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2> local_40;
  epoll_event event;
  
  if (0 < timeout) {
    std::__shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,&request->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>);
    add_time(this,(shared_ptr<Channel> *)&local_40,timeout);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  __fd = Channel::getFd((request->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  peVar2 = (request->super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  event.events = peVar2->events_;
  _Var1 = peVar2->lastEvents_;
  peVar2->lastEvents_ = event.events;
  if (_Var1 != event.events) {
    event.data.fd = __fd;
    iVar3 = epoll_ctl(this->epollFd_,3,__fd,(epoll_event *)&event);
    if (iVar3 < 0) {
      perror("epoll_mod error");
      std::__shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>::reset
                (&this->fd2chan_[__fd].super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>);
    }
  }
  return;
}

Assistant:

void Epoll::epoll_mod(SP_Channel request, int timeout){
    if(timeout > 0) add_time(request, timeout);
    int fd=request->getFd();
    if(!request->EqualAndUpdateLastEvents()){
        struct epoll_event event;
        event.data.fd=fd;
        event.events=request->getEvents();
        if(epoll_ctl(epollFd_, EPOLL_CTL_MOD, fd, &event)<0){
            perror("epoll_mod error");
            fd2chan_[fd].reset();
        }
    }
}